

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_storage.cpp
# Opt level: O3

void __thiscall
duckdb::LocalStorage::LocalMerge(LocalStorage *this,DataTable *table,RowGroupCollection *collection)

{
  DuckTransaction *transaction;
  bool bVar1;
  LocalTableStorage *this_00;
  RowGroupCollection *pRVar2;
  idx_t val;
  long lVar3;
  row_t base_id;
  ErrorData error;
  undefined1 local_d8 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  undefined1 local_b0 [128];
  
  this_00 = LocalTableManager::GetOrCreateStorage(&this->table_manager,this->context,table);
  bVar1 = TableIndexList::Empty(&this_00->append_indexes);
  if (!bVar1) {
    pRVar2 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(&this_00->row_groups);
    val = RowGroupCollection::GetTotalRows(pRVar2);
    lVar3 = NumericCastImpl<long,_unsigned_long,_false>::Convert(val);
    local_b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(lVar3 + 0x7ffffffffff080);
    transaction = this->transaction;
    DataTable::GetTypes((vector<duckdb::LogicalType,_true> *)local_d8,table);
    LocalTableStorage::AppendToIndexes
              ((ErrorData *)local_b0,this_00,transaction,collection,&this_00->append_indexes,
               (vector<duckdb::LogicalType,_true> *)local_d8,(row_t *)&local_b8);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_d8);
    if (local_b0[0] == true) {
      local_d8._0_8_ = local_d8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d8,anon_var_dwarf_6372561 + 9);
      ErrorData::Throw((ErrorData *)local_b0,(string *)local_d8);
    }
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)(local_b0 + 0x48));
    if ((undefined1 *)local_b0._40_8_ != local_b0 + 0x38) {
      operator_delete((void *)local_b0._40_8_);
    }
    if ((undefined1 *)local_b0._8_8_ != local_b0 + 0x18) {
      operator_delete((void *)local_b0._8_8_);
    }
  }
  pRVar2 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(&this_00->row_groups);
  RowGroupCollection::MergeStorage
            (pRVar2,collection,(optional_ptr<duckdb::DataTable,_true>)0x0,
             (optional_ptr<duckdb::StorageCommitState,_true>)0x0);
  this_00->merged_storage = true;
  return;
}

Assistant:

void LocalStorage::LocalMerge(DataTable &table, RowGroupCollection &collection) {
	auto &storage = table_manager.GetOrCreateStorage(context, table);
	if (!storage.append_indexes.Empty()) {
		// append data to indexes if required
		row_t base_id = MAX_ROW_ID + NumericCast<row_t>(storage.row_groups->GetTotalRows());
		auto error =
		    storage.AppendToIndexes(transaction, collection, storage.append_indexes, table.GetTypes(), base_id);
		if (error.HasError()) {
			error.Throw();
		}
	}
	storage.row_groups->MergeStorage(collection, nullptr, nullptr);
	storage.merged_storage = true;
}